

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::indent(StyledWriter *this)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)this->indentSize_);
  std::__cxx11::string::_M_append((char *)&this->indentString_,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void StyledWriter::indent() { indentString_ += String(indentSize_, ' '); }